

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O2

void __thiscall minja::Value::push_back(Value *this,Value *v)

{
  vector<minja::Value,_std::allocator<minja::Value>_> *this_00;
  runtime_error *this_01;
  string sStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  this_00 = (this->array_).
            super___shared_ptr<std::vector<minja::Value,_std::allocator<minja::Value>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr;
  if (this_00 != (vector<minja::Value,_std::allocator<minja::Value>_> *)0x0) {
    std::vector<minja::Value,_std::allocator<minja::Value>_>::push_back(this_00,v);
    return;
  }
  this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
  dump_abi_cxx11_(&sStack_58,this,-1,false);
  std::operator+(&local_38,"Value is not an array: ",&sStack_58);
  std::runtime_error::runtime_error(this_01,(string *)&local_38);
  __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void push_back(const Value& v) {
    if (!array_)
      throw std::runtime_error("Value is not an array: " + dump());
    array_->push_back(v);
  }